

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::
     TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t r;
  idx_t extraout_RDX;
  uint64_t *puVar3;
  idx_t iVar4;
  ParquetUUIDTargetType target_value_00;
  hugeint_t input;
  ParquetUUIDTargetType target_value;
  data_t local_40 [16];
  
  if (chunk_start < chunk_end) {
    uVar2 = chunk_start * 0x10;
    puVar3 = (uint64_t *)(col->data + uVar2 + 8);
    iVar4 = chunk_start;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) ||
         (uVar2 = iVar4 >> 6, (puVar1[uVar2] >> (iVar4 & 0x3f) & 1) != 0)) {
        input.upper = chunk_start;
        input.lower = *puVar3;
        local_40 = (data_t  [16])
                   ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                             ((ParquetUUIDOperator *)puVar3[-1],input);
        target_value_00.bytes._0_8_ = local_40._8_8_;
        target_value_00.bytes[8] = (char)uVar2;
        target_value_00.bytes[9] = (char)(uVar2 >> 8);
        target_value_00.bytes[10] = (char)(uVar2 >> 0x10);
        target_value_00.bytes[0xb] = (char)(uVar2 >> 0x18);
        target_value_00.bytes[0xc] = (char)(uVar2 >> 0x20);
        target_value_00.bytes[0xd] = (char)(uVar2 >> 0x28);
        target_value_00.bytes[0xe] = (char)(uVar2 >> 0x30);
        target_value_00.bytes[0xf] = (char)(uVar2 >> 0x38);
        ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                  ((ParquetUUIDOperator *)stats,local_40._0_8_,target_value_00);
        (**ser->_vptr_WriteStream)(ser,local_40,0x10);
        chunk_start = extraout_RDX;
      }
      iVar4 = iVar4 + 1;
      puVar3 = puVar3 + 2;
    } while (chunk_end != iVar4);
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}